

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O3

REF_STATUS
ref_cavity_form_edge_split
          (REF_CAVITY ref_cavity,REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_INT new_node)

{
  int iVar1;
  int iVar2;
  int iVar3;
  REF_NODE ref_node;
  REF_INT *pRVar4;
  REF_CELL pRVar5;
  REF_ADJ pRVar6;
  REF_INT *pRVar7;
  REF_ADJ_ITEM pRVar8;
  int iVar9;
  int iVar10;
  REF_INT RVar11;
  uint uVar12;
  REF_INT RVar13;
  int iVar14;
  REF_STATUS RVar15;
  int iVar16;
  undefined8 uVar17;
  long lVar18;
  ulong uVar19;
  char *pcVar20;
  long lVar21;
  long lVar22;
  REF_BOOL all_local;
  REF_INT seg_nodes [3];
  REF_INT face_nodes [3];
  REF_BOOL already_have_it;
  REF_BOOL has_triangle;
  long local_88;
  int local_70;
  int local_6c;
  int local_68;
  REF_INT local_64;
  ulong local_60;
  long local_58;
  int local_4c [4];
  int local_3c;
  long local_38;
  
  ref_node = ref_grid->node;
  ref_cavity->ref_grid = ref_grid;
  ref_cavity->node = new_node;
  pRVar4 = ref_node->part;
  iVar1 = ref_node->ref_mpi->id;
  lVar21 = (long)node0;
  if (((iVar1 == pRVar4[lVar21]) && (iVar1 == pRVar4[node1])) && (iVar1 == pRVar4[new_node])) {
    if ((ref_grid->cell[9]->n < 1) && (ref_grid->cell[10]->n < 1)) {
      ref_cavity->split_node0 = node0;
      ref_cavity->split_node1 = node1;
      if (-1 < node0) {
        pRVar5 = ref_grid->cell[8];
        pRVar6 = pRVar5->ref_adj;
        if ((node0 < pRVar6->nnode) && (local_88 = (long)pRVar6->first[lVar21], local_88 != -1)) {
          pRVar8 = pRVar6->item + local_88;
          RVar11 = pRVar5->node_per;
          local_58 = lVar21;
          while( true ) {
            if (0 < RVar11) {
              iVar1 = pRVar8->ref;
              uVar19 = 0;
              do {
                local_60 = uVar19;
                if (pRVar5->c2n[pRVar5->size_per * iVar1 + (int)uVar19] == node1) {
                  uVar12 = ref_list_contains(ref_cavity->tet_list,iVar1,local_4c + 3);
                  if (uVar12 != 0) {
                    pcVar20 = "have tet?";
                    uVar17 = 0x589;
                    goto LAB_001597a7;
                  }
                  if (local_4c[3] != 0) {
                    pcVar20 = "added tet twice?";
                    uVar17 = 0x58a;
                    goto LAB_00159be8;
                  }
                  uVar12 = ref_list_push(ref_cavity->tet_list,iVar1);
                  if (uVar12 != 0) {
                    pcVar20 = "save tet";
                    uVar17 = 0x58b;
                    goto LAB_001597a7;
                  }
                  uVar12 = ref_cell_all_local(pRVar5,ref_node,iVar1,&local_70);
                  if (uVar12 != 0) {
                    pcVar20 = "local cell";
                    uVar17 = 0x58c;
                    goto LAB_001597a7;
                  }
                  if (local_70 == 0) goto LAB_00159977;
                  iVar16 = pRVar5->face_per;
                  if (0 < iVar16) {
                    lVar22 = 0;
                    lVar21 = 0;
                    do {
                      pRVar4 = pRVar5->c2n;
                      iVar14 = pRVar5->size_per;
                      pRVar7 = pRVar5->f2n;
                      lVar18 = 0;
                      do {
                        local_4c[lVar18] =
                             pRVar4[(long)*(int *)((long)pRVar7 + lVar18 * 4 + lVar22) +
                                    (long)iVar14 * (long)iVar1];
                        lVar18 = lVar18 + 1;
                      } while (lVar18 != 3);
                      if ((local_4c[1] != node0 && local_4c[0] != node0) && local_4c[2] != node0 ||
                          (local_4c[1] != node1 && local_4c[0] != node1) && local_4c[2] != node1) {
                        uVar12 = ref_cavity_insert_face(ref_cavity,local_4c);
                        if (uVar12 != 0) {
                          pcVar20 = "tet side";
                          uVar17 = 0x59b;
                          goto LAB_001597a7;
                        }
                        iVar16 = pRVar5->face_per;
                      }
                      lVar21 = lVar21 + 1;
                      lVar22 = lVar22 + 0x10;
                    } while (lVar21 < iVar16);
                  }
                }
                uVar12 = (int)local_60 + 1;
                uVar19 = (ulong)uVar12;
                RVar11 = pRVar5->node_per;
              } while ((int)uVar12 < RVar11);
            }
            pRVar8 = pRVar5->ref_adj->item;
            local_88 = (long)pRVar8[(int)local_88].next;
            lVar21 = local_58;
            if (local_88 == -1) break;
            pRVar8 = pRVar8 + local_88;
          }
        }
      }
      pRVar5 = ref_grid->cell[3];
      uVar12 = ref_cell_has_side(pRVar5,node0,node1,&local_3c);
      if (uVar12 == 0) {
        if (local_3c != 0) {
          if (((-1 < node0) && (pRVar6 = pRVar5->ref_adj, node0 < pRVar6->nnode)) &&
             (lVar22 = (long)pRVar6->first[lVar21], lVar22 != -1)) {
            RVar11 = node1;
            if (node0 < node1) {
              RVar11 = node0;
            }
            RVar13 = node1;
            if (node1 < node0) {
              RVar13 = node0;
            }
            local_60 = CONCAT44(local_60._4_4_,RVar13);
            pRVar8 = pRVar6->item + lVar22;
            RVar13 = pRVar5->node_per;
            local_58 = lVar21;
            local_38 = lVar22;
            while( true ) {
              if (0 < RVar13) {
                iVar1 = pRVar8->ref;
                iVar16 = 0;
                do {
                  if (pRVar5->c2n[pRVar5->size_per * iVar1 + iVar16] == node1) {
                    uVar12 = ref_list_push(ref_cavity->tri_list,iVar1);
                    if (uVar12 != 0) {
                      pcVar20 = "save tri";
                      uVar17 = 0x5a5;
                      goto LAB_001597a7;
                    }
                    uVar12 = ref_cell_all_local(pRVar5,ref_node,iVar1,&local_70);
                    if (uVar12 != 0) {
                      pcVar20 = "local cell";
                      uVar17 = 0x5a7;
                      goto LAB_001597a7;
                    }
                    if (local_70 == 0) goto LAB_00159977;
                    iVar14 = pRVar5->edge_per;
                    if (0 < iVar14) {
                      lVar21 = 0;
                      do {
                        pRVar4 = pRVar5->c2n;
                        lVar22 = (long)pRVar5->size_per * (long)iVar1;
                        lVar18 = (long)(int)lVar22;
                        iVar2 = pRVar4[pRVar5->e2n[lVar21 * 2] + lVar18];
                        iVar3 = pRVar4[pRVar5->e2n[lVar21 * 2 + 1] + lVar18];
                        iVar9 = iVar3;
                        if (iVar2 < iVar3) {
                          iVar9 = iVar2;
                        }
                        iVar10 = iVar3;
                        if (iVar3 < iVar2) {
                          iVar10 = iVar2;
                        }
                        if ((RVar11 != iVar9) || ((int)local_60 != iVar10)) {
                          local_64 = pRVar4[lVar22 + 3];
                          local_6c = iVar2;
                          local_68 = iVar3;
                          uVar12 = ref_cavity_insert_seg(ref_cavity,&local_6c);
                          if (uVar12 != 0) {
                            pcVar20 = "tri side";
                            uVar17 = 0x5b6;
                            goto LAB_001597a7;
                          }
                          iVar14 = pRVar5->edge_per;
                        }
                        lVar21 = lVar21 + 1;
                      } while (lVar21 < iVar14);
                    }
                  }
                  iVar16 = iVar16 + 1;
                  RVar13 = pRVar5->node_per;
                } while (iVar16 < RVar13);
              }
              pRVar8 = pRVar5->ref_adj->item;
              lVar22 = (long)pRVar8[(int)local_38].next;
              lVar21 = local_58;
              if (lVar22 == -1) break;
              pRVar8 = pRVar8 + lVar22;
              local_38 = lVar22;
            }
          }
          iVar1 = ref_cavity->tri_list->n;
          if (1 < iVar1 - 1U) {
            pcVar20 = "expect one or two tri";
            uVar17 = 0x5bc;
LAB_00159be8:
            printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,uVar17,"ref_cavity_form_edge_split",pcVar20);
            return 1;
          }
          if (((iVar1 == 1 && -1 < node0) && (pRVar6 = pRVar5->ref_adj, node0 < pRVar6->nnode)) &&
             (local_88 = (long)pRVar6->first[lVar21], local_88 != -1)) {
            pRVar8 = pRVar6->item + local_88;
            iVar1 = node1;
            if (node0 < node1) {
              iVar1 = node0;
            }
            if (node0 <= node1) {
              node0 = node1;
            }
            RVar11 = pRVar5->node_per;
            while( true ) {
              if (0 < RVar11) {
                iVar16 = pRVar8->ref;
                uVar19 = 0;
                do {
                  if ((pRVar5->c2n[pRVar5->size_per * iVar16 + (int)uVar19] == node1) &&
                     (iVar14 = pRVar5->edge_per, 0 < iVar14)) {
                    lVar21 = 0;
                    local_60 = uVar19;
                    do {
                      pRVar4 = pRVar5->c2n;
                      lVar22 = (long)pRVar5->size_per * (long)iVar16;
                      lVar18 = (long)(int)lVar22;
                      iVar2 = pRVar4[pRVar5->e2n[lVar21 * 2] + lVar18];
                      iVar3 = pRVar4[pRVar5->e2n[lVar21 * 2 + 1] + lVar18];
                      iVar9 = iVar3;
                      if (iVar2 < iVar3) {
                        iVar9 = iVar2;
                      }
                      iVar10 = iVar3;
                      if (iVar3 < iVar2) {
                        iVar10 = iVar2;
                      }
                      if ((iVar1 == iVar9) && (node0 == iVar10)) {
                        local_64 = pRVar4[lVar22 + 3];
                        local_6c = iVar2;
                        local_68 = new_node;
                        uVar12 = ref_cavity_insert_seg(ref_cavity,&local_6c);
                        if (uVar12 != 0) {
                          pcVar20 = "tri side";
                          uVar17 = 0x5c9;
                          goto LAB_001597a7;
                        }
                        local_64 = pRVar5->c2n[(long)pRVar5->size_per * (long)iVar16 + 3];
                        local_6c = new_node;
                        local_68 = iVar3;
                        uVar12 = ref_cavity_insert_seg(ref_cavity,&local_6c);
                        if (uVar12 != 0) {
                          pcVar20 = "tri side";
                          uVar17 = 0x5cd;
                          goto LAB_001597a7;
                        }
                        iVar14 = pRVar5->edge_per;
                      }
                      lVar21 = lVar21 + 1;
                    } while (lVar21 < iVar14);
                    RVar11 = pRVar5->node_per;
                    uVar19 = local_60;
                  }
                  uVar12 = (int)uVar19 + 1;
                  uVar19 = (ulong)uVar12;
                } while ((int)uVar12 < RVar11);
              }
              pRVar8 = pRVar5->ref_adj->item;
              local_88 = (long)pRVar8[(int)local_88].next;
              if (local_88 == -1) break;
              pRVar8 = pRVar8 + local_88;
            }
          }
        }
        RVar15 = ref_cavity_verify_face_manifold(ref_cavity);
        if (RVar15 == 0) {
          RVar15 = ref_cavity_verify_seg_manifold(ref_cavity);
          if (RVar15 == 0) {
            return 0;
          }
          pcVar20 = "split seg manifold";
          uVar17 = 0x5d5;
        }
        else {
          pcVar20 = "split face manifold";
          uVar17 = 0x5d4;
        }
        uVar12 = 1;
        uVar19 = 1;
      }
      else {
        pcVar20 = "triangle side";
        uVar17 = 0x5a2;
LAB_001597a7:
        uVar19 = (ulong)uVar12;
      }
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             uVar17,"ref_cavity_form_edge_split",uVar19,pcVar20);
      return uVar12;
    }
    ref_cavity->state = REF_CAVITY_MANIFOLD_CONSTRAINED;
  }
  else {
LAB_00159977:
    ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_form_edge_split(REF_CAVITY ref_cavity,
                                              REF_GRID ref_grid, REF_INT node0,
                                              REF_INT node1, REF_INT new_node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell_node, cell;
  REF_INT face_node, cell_face;
  REF_BOOL has_triangle, has_node0, has_node1;
  REF_BOOL already_have_it, all_local;
  REF_INT face_nodes[3], seg_nodes[3];
  REF_INT cell_edge, n0, n1;

  RSS(ref_cavity_form_empty(ref_cavity, ref_grid, new_node), "init form empty");
  if (!ref_node_owned(ref_node, node0) || !ref_node_owned(ref_node, node1) ||
      !ref_node_owned(ref_node, new_node)) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
    return REF_SUCCESS;
  }

  /* mixed element protections are not mature */
  if (ref_cell_n(ref_grid_pyr(ref_grid)) > 0 ||
      ref_cell_n(ref_grid_pri(ref_grid)) > 0) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_MANIFOLD_CONSTRAINED;
    return REF_SUCCESS;
  }

  ref_cavity->split_node0 = node0;
  ref_cavity->split_node1 = node1;

  ref_cell = ref_grid_tet(ref_grid);
  each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
    RSS(ref_list_contains(ref_cavity_tet_list(ref_cavity), cell,
                          &already_have_it),
        "have tet?");
    RAS(!already_have_it, "added tet twice?");
    RSS(ref_list_push(ref_cavity_tet_list(ref_cavity), cell), "save tet");
    RSS(ref_cell_all_local(ref_cell, ref_node, cell, &all_local), "local cell");
    if (!all_local) {
      ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
      return REF_SUCCESS;
    }
    each_ref_cell_cell_face(ref_cell, cell_face) {
      each_ref_cavity_face_node(ref_cavity, face_node) {
        face_nodes[face_node] =
            ref_cell_f2n(ref_cell, face_node, cell_face, cell);
      }
      has_node0 = (node0 == face_nodes[0] || node0 == face_nodes[1] ||
                   node0 == face_nodes[2]);
      has_node1 = (node1 == face_nodes[0] || node1 == face_nodes[1] ||
                   node1 == face_nodes[2]);
      if (!(has_node0 && has_node1)) {
        RSS(ref_cavity_insert_face(ref_cavity, face_nodes), "tet side");
      }
    }
  }

  ref_cell = ref_grid_tri(ref_grid);
  RSS(ref_cell_has_side(ref_cell, node0, node1, &has_triangle),
      "triangle side");
  if (has_triangle) {
    each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
      RSS(ref_list_push(ref_cavity_tri_list(ref_cavity), cell), "save tri");
      RSS(ref_cell_all_local(ref_cell, ref_node, cell, &all_local),
          "local cell");
      if (!all_local) {
        ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
        return REF_SUCCESS;
      }
      each_ref_cell_cell_edge(ref_cell, cell_edge) {
        n0 = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
        n1 = ref_cell_e2n(ref_cell, 1, cell_edge, cell);
        if (MIN(node0, node1) == MIN(n0, n1) &&
            MAX(node0, node1) == MAX(n0, n1)) {
          /* skip the edge to be split */
        } else {
          seg_nodes[0] = n0;
          seg_nodes[1] = n1;
          seg_nodes[2] = ref_cell_c2n(ref_cell, 3, cell);
          RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
        }
      }
    }
    RAS(1 == ref_list_n(ref_cavity_tri_list(ref_cavity)) ||
            2 == ref_list_n(ref_cavity_tri_list(ref_cavity)),
        "expect one or two tri");
    if (1 == ref_list_n(ref_cavity_tri_list(ref_cavity))) {
      each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node,
                                 cell) {
        each_ref_cell_cell_edge(ref_cell, cell_edge) {
          n0 = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
          n1 = ref_cell_e2n(ref_cell, 1, cell_edge, cell);
          if (MIN(node0, node1) == MIN(n0, n1) &&
              MAX(node0, node1) == MAX(n0, n1)) {
            /* close topo with explicit edge split */
            seg_nodes[0] = n0;
            seg_nodes[1] = new_node;
            seg_nodes[2] = ref_cell_c2n(ref_cell, 3, cell);
            RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
            seg_nodes[0] = new_node;
            seg_nodes[1] = n1;
            seg_nodes[2] = ref_cell_c2n(ref_cell, 3, cell);
            RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
          }
        }
      }
    }
  }

  RSS(ref_cavity_verify_face_manifold(ref_cavity), "split face manifold");
  RSS(ref_cavity_verify_seg_manifold(ref_cavity), "split seg manifold");

  return REF_SUCCESS;
}